

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

BUFFER_HANDLE constructDeviceOrModuleJson(IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  _Bool _Var1;
  JSON_Status JVar2;
  LOGGER_LOG p_Var3;
  JSON_Value *value;
  char *string;
  char *pcVar4;
  uchar *source;
  size_t size;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  char *serialized_string;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int iotEdge_capable;
  char *authTypeForJson;
  JSON_Object *pJStack_28;
  JSON_Status jsonStatus;
  JSON_Object *root_object;
  JSON_Value *root_value;
  BUFFER_HANDLE result;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_local;
  
  pJStack_28 = (JSON_Object *)0x0;
  _Var1 = deviceOrModuleInfo->iotEdge_capable;
  if (deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",0x1be,1,"deviceOrModuleInfo cannot be null");
    }
  }
  else if ((deviceOrModuleInfo->deviceId == (char *)0x0) &&
          (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"constructDeviceOrModuleJson",0x1c3,1,"Device id cannot be NULL");
  }
  value = json_value_init_object();
  if (value == (JSON_Value *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",0x1c8,1,"json_value_init_object failed");
    }
    root_value = (JSON_Value *)0x0;
  }
  else {
    pJStack_28 = json_value_get_object(value);
    if (pJStack_28 == (JSON_Object *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"constructDeviceOrModuleJson",0x1cd,1,"json_value_get_object failed");
      }
      root_value = (JSON_Value *)0x0;
    }
    else {
      JVar2 = json_object_set_string
                        (pJStack_28,DEVICE_JSON_KEY_DEVICE_NAME,deviceOrModuleInfo->deviceId);
      if (JVar2 == 0) {
        if ((deviceOrModuleInfo->moduleId == (char *)0x0) ||
           (JVar2 = json_object_set_string
                              (pJStack_28,DEVICE_JSON_KEY_MODULE_NAME,deviceOrModuleInfo->moduleId),
           JVar2 == 0)) {
          if ((deviceOrModuleInfo->managedBy == (char *)0x0) ||
             (JVar2 = json_object_set_string
                                (pJStack_28,DEVICE_JSON_KEY_MANAGED_BY,deviceOrModuleInfo->managedBy
                                ), JVar2 == 0)) {
            pcVar4 = DEVICE_JSON_KEY_DEVICE_STATUS;
            string = getStatusStringForJson(deviceOrModuleInfo->status);
            JVar2 = json_object_dotset_string(pJStack_28,pcVar4,string);
            if (JVar2 == 0) {
              pcVar4 = getAuthTypeStringForJson(deviceOrModuleInfo->authMethod);
              if ((pcVar4 == (char *)0x0) ||
                 (JVar2 = json_object_dotset_string
                                    (pJStack_28,DEVICE_JSON_KEY_DEVICE_AUTH_TYPE,pcVar4), JVar2 != 0
                 )) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"constructDeviceOrModuleJson",0x1e6,1,
                            "json_object_dotset_string failed for authType");
                }
                root_value = (JSON_Value *)0x0;
              }
              else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) &&
                      (JVar2 = json_object_dotset_string
                                         (pJStack_28,DEVICE_JSON_KEY_DEVICE_PRIMARY_KEY,
                                          deviceOrModuleInfo->primaryKey), JVar2 != 0)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"constructDeviceOrModuleJson",0x1ee,1,
                            "json_object_dotset_string failed for primarykey");
                }
                root_value = (JSON_Value *)0x0;
              }
              else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) &&
                      (JVar2 = json_object_dotset_string
                                         (pJStack_28,DEVICE_JSON_KEY_DEVICE_SECONDARY_KEY,
                                          deviceOrModuleInfo->secondaryKey), JVar2 != 0)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"constructDeviceOrModuleJson",499,1,
                            "json_object_dotset_string failed for secondaryKey");
                }
                root_value = (JSON_Value *)0x0;
              }
              else if ((deviceOrModuleInfo->authMethod ==
                        IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) &&
                      (JVar2 = json_object_dotset_string
                                         (pJStack_28,DEVICE_JSON_KEY_DEVICE_PRIMARY_THUMBPRINT,
                                          deviceOrModuleInfo->primaryKey), JVar2 != 0)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"constructDeviceOrModuleJson",0x1f8,1,
                            "json_object_dotset_string failed for primaryThumbprint");
                }
                root_value = (JSON_Value *)0x0;
              }
              else if ((deviceOrModuleInfo->authMethod ==
                        IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) &&
                      (JVar2 = json_object_dotset_string
                                         (pJStack_28,DEVICE_JSON_KEY_DEVICE_SECONDARY_THUMBPRINT,
                                          deviceOrModuleInfo->secondaryKey), JVar2 != 0)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"constructDeviceOrModuleJson",0x1fd,1,
                            "json_object_dotset_string failed for secondaryThumbprint");
                }
                root_value = (JSON_Value *)0x0;
              }
              else if ((deviceOrModuleInfo->moduleId == (char *)0x0) &&
                      (JVar2 = json_object_dotset_boolean
                                         (pJStack_28,DEVICE_JSON_KEY_CAPABILITIES_IOTEDGE,
                                          (uint)((_Var1 & 1U) == 1)), JVar2 != 0)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"constructDeviceOrModuleJson",0x202,1,
                            "json_object_dotset_string failed for iotEdge capable");
                }
                root_value = (JSON_Value *)0x0;
              }
              else {
                source = (uchar *)json_serialize_to_string(value);
                if (source == (uchar *)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"constructDeviceOrModuleJson",0x20a,1,
                              "json_serialize_to_string failed");
                  }
                  root_value = (JSON_Value *)0x0;
                }
                else {
                  size = strlen((char *)source);
                  root_value = (JSON_Value *)BUFFER_create(source,size);
                  if (root_value == (JSON_Value *)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                ,"constructDeviceOrModuleJson",0x211,1,"Buffer_Create failed");
                    }
                    root_value = (JSON_Value *)0x0;
                  }
                  json_free_serialized_string((char *)source);
                }
              }
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"constructDeviceOrModuleJson",0x1e1,1,
                          "json_object_dotset_string failed for status");
              }
              root_value = (JSON_Value *)0x0;
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"constructDeviceOrModuleJson",0x1dc,1,
                        "json_object_set_string failed for managedBy");
            }
            root_value = (JSON_Value *)0x0;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"constructDeviceOrModuleJson",0x1d7,1,
                      "json_object_set_string failed for moduleId");
          }
          root_value = (JSON_Value *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"constructDeviceOrModuleJson",0x1d2,1,
                    "json_object_set_string failed for deviceId");
        }
        root_value = (JSON_Value *)0x0;
      }
    }
  }
  JVar2 = json_object_clear(pJStack_28);
  if (JVar2 != 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"constructDeviceOrModuleJson",0x21a,1,"json_object_clear failed");
    }
    BUFFER_delete((BUFFER_HANDLE)root_value);
    root_value = (JSON_Value *)0x0;
  }
  if (value != (JSON_Value *)0x0) {
    json_value_free(value);
  }
  return (BUFFER_HANDLE)root_value;
}

Assistant:

static BUFFER_HANDLE constructDeviceOrModuleJson(const IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    BUFFER_HANDLE result;

    JSON_Value* root_value = NULL;
    JSON_Object* root_object = NULL;
    JSON_Status jsonStatus;

    const char *authTypeForJson;

    int iotEdge_capable = (deviceOrModuleInfo->iotEdge_capable == true) ? 1 : 0;

    if (deviceOrModuleInfo == NULL)
    {
        LogError("deviceOrModuleInfo cannot be null");
        result = NULL;
    }
    else if (deviceOrModuleInfo->deviceId == NULL)
    {
        LogError("Device id cannot be NULL");
        result = NULL;
    }
    if ((root_value = json_value_init_object()) == NULL)
    {
        LogError("json_value_init_object failed");
        result = NULL;
    }
    else if ((root_object = json_value_get_object(root_value)) == NULL)
    {
        LogError("json_value_get_object failed");
        result = NULL;
    }
    else if ((json_object_set_string(root_object, DEVICE_JSON_KEY_DEVICE_NAME, deviceOrModuleInfo->deviceId)) != JSONSuccess)
    {
        LogError("json_object_set_string failed for deviceId");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->moduleId != NULL) && ((json_object_set_string(root_object, DEVICE_JSON_KEY_MODULE_NAME, deviceOrModuleInfo->moduleId)) != JSONSuccess))
    {
        LogError("json_object_set_string failed for moduleId");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->managedBy != NULL) && ((json_object_set_string(root_object, DEVICE_JSON_KEY_MANAGED_BY, deviceOrModuleInfo->managedBy)) != JSONSuccess))
    {
        LogError("json_object_set_string failed for managedBy");
        result = NULL;
    }
    else if (json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_STATUS, getStatusStringForJson(deviceOrModuleInfo->status)) != JSONSuccess)
    {
        LogError("json_object_dotset_string failed for status");
        result = NULL;
    }
    else if ((NULL == (authTypeForJson = getAuthTypeStringForJson(deviceOrModuleInfo->authMethod))) || ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_AUTH_TYPE, authTypeForJson)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for authType");
        result = NULL;
    }
    //
    // Static function here.  We make the assumption that the auth method has been validated by the caller of this function.
    //
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_KEY, deviceOrModuleInfo->primaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for primarykey");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_KEY, deviceOrModuleInfo->secondaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for secondaryKey");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_PRIMARY_THUMBPRINT, deviceOrModuleInfo->primaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for primaryThumbprint");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) && ((json_object_dotset_string(root_object, DEVICE_JSON_KEY_DEVICE_SECONDARY_THUMBPRINT, deviceOrModuleInfo->secondaryKey)) != JSONSuccess))
    {
        LogError("json_object_dotset_string failed for secondaryThumbprint");
        result = NULL;
    }
    else if ((deviceOrModuleInfo->moduleId == NULL) && (json_object_dotset_boolean(root_object, DEVICE_JSON_KEY_CAPABILITIES_IOTEDGE, iotEdge_capable)) != JSONSuccess)
    {
        LogError("json_object_dotset_string failed for iotEdge capable");
        result = NULL;
    }
    else
    {
        char* serialized_string;
        if ((serialized_string = json_serialize_to_string(root_value)) == NULL)
        {
            LogError("json_serialize_to_string failed");
            result = NULL;
        }
        else
        {
            if ((result = BUFFER_create((const unsigned char*)serialized_string, strlen(serialized_string))) == NULL)
            {
                LogError("Buffer_Create failed");
                result = NULL;
            }
            json_free_serialized_string(serialized_string);
        }
    }

    if ((jsonStatus = json_object_clear(root_object)) != JSONSuccess)
    {
        LogError("json_object_clear failed");
        BUFFER_delete(result);
        result = NULL;
    }
    if(root_value != NULL)
        json_value_free(root_value);

    return result;
}